

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  bool value;
  TimeInMillis local_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  value = TestCase::Passed(test_case);
  FormatBool_abi_cxx11_(&local_38,this,value);
  std::operator+(&local_b8,"event=TestCaseEnd&passed=",&local_38);
  std::operator+(&local_98,&local_b8,"&elapsed_time=");
  local_e0 = test_case->elapsed_time_;
  StreamableToString<long_long>(&local_d8,&local_e0);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,"ms");
  SendLn(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    SendLn("event=TestCaseEnd&passed=" + FormatBool(test_case.Passed())
           + "&elapsed_time=" + StreamableToString(test_case.elapsed_time())
           + "ms");
  }